

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.h
# Opt level: O0

uchar flatbuffers::GetFieldI<unsigned_char>(Table *table,Field *field)

{
  uchar uVar1;
  uint16_t field_00;
  BaseType base_type;
  Type *this;
  size_t sVar2;
  int64_t iVar3;
  Field *field_local;
  Table *table_local;
  
  this = reflection::Field::type(field);
  base_type = reflection::Type::base_type(this);
  sVar2 = GetTypeSize(base_type);
  if (sVar2 == 1) {
    field_00 = reflection::Field::offset(field);
    iVar3 = reflection::Field::default_integer(field);
    uVar1 = Table::GetField<unsigned_char>(table,field_00,(uchar)iVar3);
    return uVar1;
  }
  __assert_fail("sizeof(T) == GetTypeSize(field.type()->base_type())",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/reflection.h"
                ,0x7b,
                "T flatbuffers::GetFieldI(const Table &, const reflection::Field &) [T = unsigned char]"
               );
}

Assistant:

T GetFieldI(const Table &table, const reflection::Field &field) {
  FLATBUFFERS_ASSERT(sizeof(T) == GetTypeSize(field.type()->base_type()));
  return table.GetField<T>(field.offset(),
                           static_cast<T>(field.default_integer()));
}